

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

void backtracer_printmsg(t_pd *who,t_symbol *s,int argc,t_atom *argv)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char msgbuf [104];
  char buf [100];
  
  iVar4 = 5;
  if (argc < 5) {
    iVar4 = argc;
  }
  pcVar1 = class_getname(*who);
  snprintf(msgbuf,100,"%s: %s ",pcVar1,s->s_name);
  sVar2 = strlen(msgbuf);
  lVar5 = 0;
  while ((iVar3 = (int)sVar2, lVar5 < iVar4 && (iVar3 < 100))) {
    atom_string(argv,buf,100);
    snprintf(msgbuf + iVar3,(ulong)(100 - iVar3)," %s",buf);
    sVar2 = strlen(msgbuf);
    lVar5 = lVar5 + 1;
    argv = argv + 1;
  }
  if (argc < 6 || 99 < iVar3) {
    builtin_strncpy(msgbuf + 100,"...",4);
  }
  else {
    builtin_strncpy(msgbuf + iVar3,"...",4);
  }
  logpost(who,2,"%s",msgbuf);
  return;
}

Assistant:

static void backtracer_printmsg(t_pd *who, t_symbol *s,
    int argc, t_atom *argv)
{
    char msgbuf[104];
    int nprint = (argc > NARGS ? NARGS : argc), nchar, i;
    snprintf(msgbuf, 100, "%s: %s ", class_getname(*who), s->s_name);
    nchar = strlen(msgbuf);
    for (i = 0; i < nprint && nchar < 100; i++)
        if (nchar < 100)
    {
        char buf[100];
        atom_string(&argv[i], buf, 100);
        snprintf(msgbuf + nchar, 100-nchar, " %s", buf);
        nchar = strlen(msgbuf);
    }
    if (argc > nprint && nchar < 100)
        sprintf(msgbuf + nchar, "...");
    else memcpy(msgbuf+100, "...", 4); /* in case we didn't finish */
    logpost(who, 2, "%s", msgbuf);
}